

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::StoreSceneMeshes(ColladaLoader *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiMesh **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  sVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
  pScene->mNumMeshes = (uint)sVar3;
  bVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty(&this->mMeshes);
  if (!bVar2) {
    sVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiMesh **)operator_new__(uVar4);
    pScene->mMeshes = ppaVar5;
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->mMeshes);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->mMeshes);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,pScene->mMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::clear(&this->mMeshes);
  }
  return;
}

Assistant:

void ColladaLoader::StoreSceneMeshes( aiScene* pScene) {
    pScene->mNumMeshes = static_cast<unsigned int>(mMeshes.size());
    if( mMeshes.empty() ) {
        return;
    }
    pScene->mMeshes = new aiMesh*[mMeshes.size()];
    std::copy( mMeshes.begin(), mMeshes.end(), pScene->mMeshes);
    mMeshes.clear();
}